

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamping.c
# Opt level: O0

int timespec_diff(timespec *res,timespec *a,timespec *b)

{
  uint32_t billion;
  timespec *b_local;
  timespec *a_local;
  timespec *res_local;
  
  if ((a == (timespec *)0x0) || (b == (timespec *)0x0)) {
    res_local._4_4_ = -1;
  }
  else if ((a->tv_sec == 0) || (b->tv_sec == 0)) {
    res_local._4_4_ = -1;
  }
  else {
    if (a->tv_nsec < b->tv_nsec) {
      res->tv_nsec = b->tv_nsec - a->tv_nsec;
      res->tv_nsec = 1000000000 - res->tv_nsec;
      res->tv_sec = (a->tv_sec + -1) - b->tv_sec;
    }
    else {
      res->tv_nsec = a->tv_nsec - b->tv_nsec;
      res->tv_sec = a->tv_sec - b->tv_sec;
    }
    res_local._4_4_ = 0;
  }
  return res_local._4_4_;
}

Assistant:

int timespec_diff(struct timespec *res, struct timespec *a, struct timespec *b)
{
	uint32_t billion = 1e9;

	if (!a || !b)
		return -1;
	if (a->tv_sec == 0 || b->tv_sec == 0)
		return -1;

	if (a->tv_nsec < b->tv_nsec) {
		res->tv_nsec = b->tv_nsec - a->tv_nsec;
		res->tv_nsec = billion - res->tv_nsec;
		res->tv_sec = a->tv_sec - 1 - b->tv_sec;

	} else {
		res->tv_nsec = a->tv_nsec - b->tv_nsec;
		res->tv_sec = a->tv_sec - b->tv_sec;
	}

	return 0;
}